

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::addField(QWizardPrivate *this,QWizardField *field)

{
  char *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QWizardField myField;
  Connection CStack_d8;
  QObject local_d0 [8];
  int local_c8 [6];
  char *local_b0;
  undefined1 local_a8 [40];
  QObject *pQStack_80;
  Data *local_78;
  char *pcStack_70;
  undefined1 *local_68;
  Data *pDStack_60;
  QObject *local_58;
  undefined1 *puStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWizardField::QWizardField((QWizardField *)local_a8,field);
  QWizardField::resolve((QWizardField *)local_a8,&this->defaultPropertyTable);
  bVar2 = QMap<QString,_int>::contains(&this->fieldIndexMap,(QString *)(local_a8 + 8));
  if (bVar2) {
    local_c8[0] = 2;
    local_c8[5] = 0;
    local_c8[1] = 0;
    local_c8[2] = 0;
    local_c8[3] = 0;
    local_c8[4] = 0;
    local_b0 = "default";
    uVar3 = QString::utf16();
    QMessageLogger::warning((char *)local_c8,"QWizardPage::addField: Duplicate field \'%ls\'",uVar3)
    ;
  }
  else {
    local_c8[0] = (int)(this->fields).d.size;
    QMap<QString,_int>::insert(&this->fieldIndexMap,(QString *)(local_a8 + 8),local_c8);
    QList<QWizardField>::emplaceBack<QWizardField_const&>(&this->fields,(QWizardField *)local_a8);
    if ((local_a8[0x20] == true) && (puStack_50 != (undefined1 *)0x0)) {
      pQVar4 = local_58;
      if (local_58 == (QObject *)0x0) {
        pQVar4 = (QObject *)&QByteArray::_empty;
      }
      QObject::connect(local_d0,(char *)pQStack_80,pQVar4,(char *)local_a8._0_8_,0x66ec4f);
      QMetaObject::Connection::~Connection((Connection *)local_d0);
    }
    QObject::connect((QObject *)&CStack_d8,(char *)pQStack_80,(QObject *)"2destroyed(QObject*)",
                     pcVar1,0x66ec6e);
    QMetaObject::Connection::~Connection(&CStack_d8);
  }
  QWizardField::~QWizardField((QWizardField *)local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::addField(const QWizardField &field)
{
    Q_Q(QWizard);

    QWizardField myField = field;
    myField.resolve(defaultPropertyTable);

    if (Q_UNLIKELY(fieldIndexMap.contains(myField.name))) {
        qWarning("QWizardPage::addField: Duplicate field '%ls'", qUtf16Printable(myField.name));
        return;
    }

    fieldIndexMap.insert(myField.name, fields.size());
    fields += myField;
    if (myField.mandatory && !myField.changedSignal.isEmpty())
        QObject::connect(myField.object, myField.changedSignal,
                         myField.page, SLOT(_q_maybeEmitCompleteChanged()));
    QObject::connect(
        myField.object, SIGNAL(destroyed(QObject*)), q,
        SLOT(_q_handleFieldObjectDestroyed(QObject*)));
}